

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxBuffer.cpp
# Opt level: O0

void __thiscall Jinx::Buffer::Read(Buffer *this,size_t *pos,BufferPtr *buffer,size_t bytes)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  element_type *peVar3;
  unsigned_long local_38;
  unsigned_long local_30;
  size_t bytesToCopy;
  size_t bytes_local;
  BufferPtr *buffer_local;
  size_t *pos_local;
  Buffer *this_local;
  
  bytesToCopy = bytes;
  bytes_local = (size_t)buffer;
  buffer_local = (BufferPtr *)pos;
  pos_local = (size_t *)this;
  if (this->m_size - *pos < bytes) {
    __assert_fail("bytes <= (m_size - *pos)",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                  ,0x2c,"void Jinx::Buffer::Read(size_t *, BufferPtr &, size_t)");
  }
  local_38 = this->m_size - *pos;
  puVar2 = std::min<unsigned_long>(&bytesToCopy,&local_38);
  local_30 = *puVar2;
  if (local_30 != 0) {
    if (local_30 == bytesToCopy) {
      peVar3 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)bytes_local);
      Reserve(peVar3,local_30);
      peVar3 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)bytes_local);
      memcpy(peVar3->m_data,
             this->m_data +
             (long)(buffer_local->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,local_30);
      uVar1 = local_30;
      (buffer_local->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)
           ((long)&((buffer_local->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->m_data + bytesToCopy);
      peVar3 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)bytes_local);
      peVar3->m_size = uVar1;
      return;
    }
    __assert_fail("bytesToCopy == bytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                  ,0x2f,"void Jinx::Buffer::Read(size_t *, BufferPtr &, size_t)");
  }
  __assert_fail("bytesToCopy",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                ,0x2e,"void Jinx::Buffer::Read(size_t *, BufferPtr &, size_t)");
}

Assistant:

inline_t void Buffer::Read(size_t * pos, BufferPtr & buffer, size_t bytes)
	{
		assert(bytes <= (m_size - *pos));
		size_t bytesToCopy = std::min(bytes, m_size - *pos);
		assert(bytesToCopy);
		assert(bytesToCopy == bytes);
		buffer->Reserve(bytesToCopy);
		memcpy(buffer->m_data, m_data + *pos, bytesToCopy);
		*pos += bytes;
		buffer->m_size = bytesToCopy;
	}